

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O3

void __thiscall indigox::Bond::Clear(Bond *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>);
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &(this->atoms_)._M_elems[0].super___weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  lVar3 = 0x20;
  do {
    ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)(this_00 + -1))->_M_ptr =
         (element_type *)0x0;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&_Stack_20);
    this_00 = this_00 + 2;
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != 0);
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(_Stack_20._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (_Stack_20._M_pi)->_M_weak_count;
      (_Stack_20._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(_Stack_20._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void Bond::Clear() {
    mol_.reset();
    atoms_.fill(Atom_wp());
  }